

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  ostream *poVar12;
  char *pcVar13;
  char tempname [4096];
  string local_1088;
  long local_1068;
  int *local_1060;
  string local_1058;
  char local_1038 [4104];
  
  lVar9 = (long)gargp;
  if (*running == 0) {
    cVar5 = (this->m_oargv).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p[1] ==
            this->m_optionFlag;
    bVar4 = !(bool)cVar5;
  }
  else {
    cVar5 = '\x02';
    bVar4 = true;
  }
  lVar8 = lVar9;
  local_1060 = running;
  if (cVar5 == '\0') {
    *position = 1;
    local_1038[0] =
         (this->m_oargv).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p[1];
    local_1038[1] = 0;
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    cVar5 = getType(this,&local_1088);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    if (cVar5 != 'b') {
LAB_00113f63:
      *position = *position + 1;
    }
  }
  else if (cVar5 == '\x02') {
    iVar7 = *position;
    *position = iVar7 + 1;
    local_1038[0] =
         (this->m_oargv).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p[(long)iVar7 + 1];
    local_1038[1] = 0;
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    cVar5 = getType(this,&local_1088);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    if (cVar5 != 'b') {
      *local_1060 = 0;
      goto LAB_00113f63;
    }
  }
  else {
    pbVar2 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 2;
    lVar8 = 0;
    while( true ) {
      *position = (int)lVar10;
      cVar5 = pbVar2[lVar9]._M_dataplus._M_p[lVar10];
      if ((cVar5 == '\0') || (cVar5 == '=')) break;
      local_1038[lVar10 + -2] = cVar5;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x100000000;
    }
    local_1038[lVar8 >> 0x20] = '\0';
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    local_1068 = lVar9;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    cVar5 = getType(this,&local_1088);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    lVar8 = local_1068;
    if (cVar5 == '\0') {
      this->m_optionsArgument = true;
    }
    else if ((this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_dataplus._M_p[*position] == '=') {
      if (cVar5 == 'b') {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "Error: boolean variable cannot have any options: ");
        pcVar13 = local_1038;
        goto LAB_001141b0;
      }
      *position = *position + 1;
    }
  }
  if (cVar5 == '\0') {
    this->m_optionsArgument = true;
    *position = 0;
    return gargp + 1;
  }
  pbVar2 = (this->m_oargv).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((cVar5 != 'b') && (pbVar2[lVar8]._M_dataplus._M_p[*position] == '\0')) {
    gargp = gargp + 1;
    *position = 0;
  }
  if ((bVar4 && cVar5 == 'b') &&
     (iVar7 = 1, pbVar2[gargp]._M_dataplus._M_p[(long)*position + 1] != '\0')) {
LAB_001140c0:
    *local_1060 = iVar7;
  }
  else if ((cVar5 == 'b') && (pbVar2[gargp]._M_dataplus._M_p[(long)*position + 1] == '\0')) {
    iVar7 = 0;
    goto LAB_001140c0;
  }
  if (gargp < this->m_oargc) {
    local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
    sVar6 = strlen(local_1038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1088,local_1038,local_1038 + sVar6);
    pcVar3 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[gargp]._M_dataplus._M_p;
    pcVar13 = pcVar3 + *position;
    paVar1 = &local_1058.field_2;
    local_1058._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar3 == (pointer)0x0) {
      pcVar11 = (char *)0x1;
    }
    else {
      sVar6 = strlen(pcVar13);
      pcVar11 = pcVar13 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,pcVar13,pcVar11);
    setModified(this,&local_1088,&local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != paVar1) {
      operator_delete(local_1058._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
      operator_delete(local_1088._M_dataplus._M_p);
    }
    return gargp + (uint)(*local_1060 == 0);
  }
  poVar12 = (ostream *)&std::cerr;
  pcVar13 = "Error: last option requires a parameter";
LAB_001141b0:
  poVar12 = std::operator<<(poVar12,pcVar13);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
	int optionForm;
	char tempname[4096];
	char optionType = OPTION_TYPE_unknown;

	if (running) {
		optionForm = OPTION_FORM_continue;
	} else if (m_oargv[gargp][1] == getFlag()) {
		optionForm = OPTION_FORM_long;
	} else {
		optionForm = OPTION_FORM_short;
	}

	switch (optionForm) {
		case OPTION_FORM_continue:
			position++;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				running = 0;
				position++;
			}
			break;
		case OPTION_FORM_short:
			position = 1;
			tempname[0] = m_oargv[gargp][position];
			tempname[1] = '\0';
			optionType = getType(tempname);
			if (optionType != OPTION_TYPE_boolean) {
				position++;
			}
			break;
		case OPTION_FORM_long:
			position = 2;
			while (m_oargv[gargp][position] != '=' &&
					m_oargv[gargp][position] != '\0') {
				tempname[position-2] = m_oargv[gargp][position];
				position++;
			}
			tempname[position-2] = '\0';
			optionType = getType(tempname);
			if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
				m_optionsArgument = 1;
				break;
			}
			if (m_oargv[gargp][position] == '=') {
				if (optionType == OPTION_TYPE_boolean) {
					std::cerr << "Error: boolean variable cannot have any options: "
					     << tempname << std::endl;
					exit(1);
				}
				position++;
			}
			break;
	}

	if (optionType == OPTION_TYPE_unknown) { // suppressed --options option
		m_optionsArgument = 1;
		gargp++;
		position = 0;
		return gargp;
	}

	if (m_oargv[gargp][position] == '\0' &&
			optionType != OPTION_TYPE_boolean) {
		gargp++;
		position = 0;
	}

	if ((optionForm != OPTION_FORM_long) && (optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] != '\0')) {
		running = 1;
	} else if ((optionType == OPTION_TYPE_boolean) &&
			(m_oargv[gargp][position+1] == '\0')) {
		running = 0;
	}

	if (gargp >= m_oargc) {
		std::cerr << "Error: last option requires a parameter" << std::endl;
		exit(1);
	}
	setModified(tempname, &m_oargv[gargp][position]);

	if (!running) {
		gargp++;
	}
	return gargp;
}